

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.h
# Opt level: O0

void convolve_2d_sr_hor_4tap_ssse3
               (uint8_t *src,int32_t src_stride,int32_t w,int32_t h,
               InterpFilterParams *filter_params_x,int32_t subpel_x_q4,int16_t *im_block)

{
  __m128i res_00;
  __m128i res_01;
  __m256i res_02;
  int in_ECX;
  int in_EDX;
  __m256i *filt;
  __m256i *coeffs;
  __m256i *res_03;
  __m256i res;
  __m256i filt_256 [2];
  __m256i coeffs_256 [2];
  __m128i r_1;
  __m128i r;
  __m128i coeffs_128 [2];
  int16_t *im;
  int32_t y;
  uint8_t *src_ptr;
  __m256i *in_stack_fffffffffffffe60;
  __m256i *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  int32_t in_stack_fffffffffffffe74;
  uint8_t *in_stack_fffffffffffffe78;
  __m256i *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  int32_t in_stack_fffffffffffffe8c;
  InterpFilterParams *in_stack_fffffffffffffe90;
  ptrdiff_t in_stack_fffffffffffffe98;
  __m256i *in_stack_fffffffffffffea0;
  __m128i *in_stack_fffffffffffffec0;
  ptrdiff_t in_stack_fffffffffffffec8;
  uint8_t *in_stack_fffffffffffffed0;
  int16_t *dst;
  undefined4 local_74;
  
  local_74 = in_ECX;
  if (in_EDX < 5) {
    prepare_half_coeffs_4tap_ssse3
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
               (__m128i *)in_stack_fffffffffffffe80);
    if (in_EDX == 2) {
      do {
        x_convolve_4tap_2x2_ssse3
                  (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
        res_00[1] = (longlong)in_stack_fffffffffffffe80;
        res_00[0] = (longlong)in_stack_fffffffffffffe78;
        xy_x_round_store_2x2_sse2
                  (res_00,(int16_t *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
        local_74 = local_74 + -2;
      } while (local_74 != 0);
    }
    else if (in_EDX == 4) {
      do {
        x_convolve_4tap_4x2_ssse3
                  (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
        res_01[1] = (longlong)in_stack_fffffffffffffe80;
        res_01[0] = (longlong)in_stack_fffffffffffffe78;
        xy_x_round_store_4x2_sse2
                  (res_01,(int16_t *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
        local_74 = local_74 + -2;
      } while (local_74 != 0);
    }
  }
  else {
    prepare_half_coeffs_4tap_avx2
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe80);
    dst = (int16_t *)0x807070606050504;
    filt = (__m256i *)0x605050404030302;
    coeffs = (__m256i *)0xa09090808070706;
    res_03 = (__m256i *)0x605050404030302;
    if (in_EDX == 8) {
      do {
        x_convolve_4tap_8x2_avx2
                  ((uint8_t *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                   (__m256i *)in_stack_fffffffffffffe90,
                   (__m256i *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        res_02[1] = (longlong)filt;
        res_02[0] = in_stack_fffffffffffffe98;
        res_02[2] = (longlong)coeffs;
        res_02[3] = (longlong)res_03;
        in_stack_fffffffffffffea0 = filt;
        xy_x_round_store_8x2_avx2(res_02,(int16_t *)in_stack_fffffffffffffe90);
        local_74 = local_74 + -2;
      } while (local_74 != 0);
    }
    else if (in_EDX == 0x10) {
      do {
        x_convolve_4tap_16x2_avx2
                  (in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,in_stack_fffffffffffffe68,
                   in_stack_fffffffffffffe60,(__m256i *)0x9b0f8c);
        xy_x_round_store_32_avx2(res_03,(int16_t *)coeffs);
        local_74 = local_74 + -2;
      } while (local_74 != 0);
    }
    else if (in_EDX == 0x20) {
      do {
        xy_x_4tap_32_avx2((uint8_t *)res_03,coeffs,filt,dst);
        local_74 = local_74 + -1;
      } while (local_74 != 0);
    }
    else if (in_EDX == 0x40) {
      do {
        xy_x_4tap_32_avx2((uint8_t *)res_03,coeffs,filt,dst);
        xy_x_4tap_32_avx2((uint8_t *)res_03,coeffs,filt,dst);
        local_74 = local_74 + -1;
      } while (local_74 != 0);
    }
    else {
      do {
        xy_x_4tap_32_avx2((uint8_t *)res_03,coeffs,filt,dst);
        xy_x_4tap_32_avx2((uint8_t *)res_03,coeffs,filt,dst);
        xy_x_4tap_32_avx2((uint8_t *)res_03,coeffs,filt,dst);
        xy_x_4tap_32_avx2((uint8_t *)res_03,coeffs,filt,dst);
        local_74 = local_74 + -1;
      } while (local_74 != 0);
    }
  }
  return;
}

Assistant:

static void convolve_2d_sr_hor_4tap_ssse3(
    const uint8_t *const src, const int32_t src_stride, const int32_t w,
    const int32_t h, const InterpFilterParams *const filter_params_x,
    const int32_t subpel_x_q4, int16_t *const im_block) {
  const uint8_t *src_ptr = src - 1;
  int32_t y = h;
  int16_t *im = im_block;

  if (w <= 4) {
    __m128i coeffs_128[2];

    prepare_half_coeffs_4tap_ssse3(filter_params_x, subpel_x_q4, coeffs_128);
    if (w == 2) {
      do {
        const __m128i r =
            x_convolve_4tap_2x2_ssse3(src_ptr, src_stride, coeffs_128);
        xy_x_round_store_2x2_sse2(r, im);
        src_ptr += 2 * src_stride;
        im += 2 * 2;
        y -= 2;
      } while (y);
    } else if (w == 4) {
      do {
        const __m128i r =
            x_convolve_4tap_4x2_ssse3(src_ptr, src_stride, coeffs_128);
        xy_x_round_store_4x2_sse2(r, im);
        src_ptr += 2 * src_stride;
        im += 2 * 4;
        y -= 2;
      } while (y);
    }
  } else {
    // TODO(chiyotsai@google.com): Add better optimization
    __m256i coeffs_256[2], filt_256[2];

    prepare_half_coeffs_4tap_avx2(filter_params_x, subpel_x_q4, coeffs_256);
    filt_256[0] = _mm256_load_si256((__m256i const *)filt1_global_avx2);
    filt_256[1] = _mm256_load_si256((__m256i const *)filt2_global_avx2);

    if (w == 8) {
      do {
        __m256i res =
            x_convolve_4tap_8x2_avx2(src_ptr, src_stride, coeffs_256, filt_256);
        xy_x_round_store_8x2_avx2(res, im);

        src_ptr += 2 * src_stride;
        im += 2 * 8;
        y -= 2;
      } while (y);
    } else if (w == 16) {
      do {
        __m256i r[2];

        x_convolve_4tap_16x2_avx2(src_ptr, src_stride, coeffs_256, filt_256, r);
        xy_x_round_store_32_avx2(r, im);
        src_ptr += 2 * src_stride;
        im += 2 * 16;
        y -= 2;
      } while (y);
    } else if (w == 32) {
      do {
        xy_x_4tap_32_avx2(src_ptr, coeffs_256, filt_256, im);

        src_ptr += src_stride;
        im += 32;
      } while (--y);
    } else if (w == 64) {
      do {
        xy_x_4tap_32_avx2(src_ptr, coeffs_256, filt_256, im);
        xy_x_4tap_32_avx2(src_ptr + 32, coeffs_256, filt_256, im + 32);
        src_ptr += src_stride;
        im += 64;
      } while (--y);
    } else {
      assert(w == 128);

      do {
        xy_x_4tap_32_avx2(src_ptr, coeffs_256, filt_256, im);
        xy_x_4tap_32_avx2(src_ptr + 32, coeffs_256, filt_256, im + 32);
        xy_x_4tap_32_avx2(src_ptr + 64, coeffs_256, filt_256, im + 64);
        xy_x_4tap_32_avx2(src_ptr + 96, coeffs_256, filt_256, im + 96);
        src_ptr += src_stride;
        im += 128;
      } while (--y);
    }
  }
}